

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerNewConcatStrMultiBE(Lowerer *this,Instr *instr)

{
  BVSparse<Memory::JitArenaAllocator> *this_00;
  code *pcVar1;
  bool bVar2;
  Opnd *pOVar3;
  undefined4 *puVar4;
  RegOpnd *baseOpnd;
  IntConstOpnd *this_01;
  StackSym *pSVar5;
  Instr *this_02;
  IndirOpnd *dstOpnd;
  Instr *pIVar6;
  Instr *newConcatItemInstr;
  Instr *hoistSrcInstr;
  Opnd *concatItemOpnd;
  Opnd *linkOpnd;
  Instr *concatItemInstr;
  Instr *pIStack_28;
  uint index;
  Opnd *newConcatItemOpnd;
  RegOpnd *newString;
  Instr *instr_local;
  Lowerer *this_local;
  
  pOVar3 = IR::Instr::GetSrc1(instr);
  bVar2 = IR::Opnd::IsConstOpnd(pOVar3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x65dd,"(instr->GetSrc1()->IsConstOpnd())","instr->GetSrc1()->IsConstOpnd()"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pOVar3 = IR::Instr::GetDst(instr);
  bVar2 = IR::Opnd::IsRegOpnd(pOVar3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x65de,"(instr->GetDst()->IsRegOpnd())","instr->GetDst()->IsRegOpnd()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pOVar3 = IR::Instr::GetDst(instr);
  baseOpnd = IR::Opnd::AsRegOpnd(pOVar3);
  pIStack_28 = (Instr *)0x0;
  pOVar3 = IR::Instr::GetSrc1(instr);
  this_01 = IR::Opnd::AsIntConstOpnd(pOVar3);
  concatItemInstr._4_4_ = IR::IntConstOpnd::AsUint32(this_01);
  concatItemOpnd = IR::Instr::GetSrc2(instr);
  do {
    concatItemInstr._4_4_ = concatItemInstr._4_4_ - 1;
    if (concatItemOpnd == (Opnd *)0x0) {
      if (concatItemInstr._4_4_ != 0xffffffff) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x6610,"(index == -1)","index == -1");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      LowerNewConcatStrMulti(this,instr);
      return;
    }
    bVar2 = IR::Opnd::IsRegOpnd(concatItemOpnd);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x65e8,"(linkOpnd->IsRegOpnd())","linkOpnd->IsRegOpnd()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pSVar5 = IR::Opnd::GetStackSym(concatItemOpnd);
    this_02 = StackSym::GetInstrDef(pSVar5);
    if (this_02->m_opcode != SetConcatStrMultiItemBE) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x65ea,
                         "(concatItemInstr->m_opcode == Js::OpCode::SetConcatStrMultiItemBE)",
                         "concatItemInstr->m_opcode == Js::OpCode::SetConcatStrMultiItemBE");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    hoistSrcInstr = (Instr *)IR::Instr::GetSrc1(this_02);
    bVar2 = IR::Opnd::IsRegOpnd((Opnd *)hoistSrcInstr);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x65ed,"(concatItemOpnd->IsRegOpnd())","concatItemOpnd->IsRegOpnd()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    bVar2 = IR::Opnd::IsEqual((Opnd *)hoistSrcInstr,&baseOpnd->super_Opnd);
    if (bVar2) {
      if (pIStack_28 == (Instr *)0x0) {
        pIVar6 = IR::Instr::HoistSrc1(this_02,Ld_A,RegNOREG,(StackSym *)0x0);
        pIStack_28 = (Instr *)IR::Instr::GetDst(pIVar6);
      }
      hoistSrcInstr = pIStack_28;
    }
    else {
      this_00 = this->addToLiveOnBackEdgeSyms;
      pSVar5 = IR::Opnd::GetStackSym((Opnd *)hoistSrcInstr);
      BVSparse<Memory::JitArenaAllocator>::Set(this_00,(pSVar5->super_Sym).m_id);
    }
    dstOpnd = IR::IndirOpnd::New(baseOpnd,concatItemInstr._4_4_,TyVar,instr->m_func,false);
    pIVar6 = IR::Instr::New(SetConcatStrMultiItem,&dstOpnd->super_Opnd,(Opnd *)hoistSrcInstr,
                            instr->m_func);
    IR::Instr::InsertAfter(instr,pIVar6);
    LowerSetConcatStrMultiItem(this,pIVar6);
    concatItemOpnd = IR::Instr::GetSrc2(this_02);
  } while( true );
}

Assistant:

void
Lowerer::LowerNewConcatStrMultiBE(IR::Instr * instr)
{
    // Lower
    // t1 = SetConcatStrMultiBE s1
    // t2 = SetConcatStrMultiBE s2, t1
    // t3 = SetConcatStrMultiBE s3, t2
    // s  = NewConcatStrMultiBE 3, t3
    //            to
    // s   = new concat string
    // s+0 = s1
    // s+1 = s2
    // s+2 = s3
    Assert(instr->GetSrc1()->IsConstOpnd());
    Assert(instr->GetDst()->IsRegOpnd());

    IR::RegOpnd * newString = instr->GetDst()->AsRegOpnd();

    IR::Opnd * newConcatItemOpnd = nullptr;
    uint index = instr->GetSrc1()->AsIntConstOpnd()->AsUint32() - 1;
    IR::Instr * concatItemInstr = nullptr;
    IR::Opnd * linkOpnd = instr->GetSrc2();
    while (linkOpnd)
    {
        Assert(linkOpnd->IsRegOpnd());
        concatItemInstr = linkOpnd->GetStackSym()->GetInstrDef();
        Assert(concatItemInstr->m_opcode == Js::OpCode::SetConcatStrMultiItemBE);

        IR::Opnd * concatItemOpnd = concatItemInstr->GetSrc1();
        Assert(concatItemOpnd->IsRegOpnd());

        // If one of the concat items is equal to the dst of the concat expressions (s = s + a + b),
        // hoist the load of that item to before the setting of the new string to the dst.
        if (concatItemOpnd->IsEqual(newString))
        {
            if (!newConcatItemOpnd)
            {
                IR::Instr * hoistSrcInstr = concatItemInstr->HoistSrc1(Js::OpCode::Ld_A);
                newConcatItemOpnd = hoistSrcInstr->GetDst();
            }
            concatItemOpnd = newConcatItemOpnd;
        }
        else
        {
            // If only some of the SetConcatStrMultiItemBE instructions were CSE'd and the rest, along with the NewConcatStrMultiBE
            // instruction, were in a loop, the strings on the CSE'd Set*BE instructions will become live on back edge. Add them to
            // addToLiveOnBackEdgeSyms here and clear when we reach the Set*BE instruction.

            // Note that we are doing this only for string opnds which are not the same as the dst of the concat expression. Reasoning
            // behind this is that if a loop has a concat expression with one of its sources same as the dst, the Set*BE instruction
            // for the dst wouldn't have been CSE'd as the dst's value is changing in the loop and the backward pass should have set the
            // symbol as live on backedge.
            this->addToLiveOnBackEdgeSyms->Set(concatItemOpnd->GetStackSym()->m_id);
        }
        IR::Instr * newConcatItemInstr = IR::Instr::New(Js::OpCode::SetConcatStrMultiItem,
                                                        IR::IndirOpnd::New(newString, index, TyVar, instr->m_func),
                                                        concatItemOpnd,
                                                        instr->m_func);
        instr->InsertAfter(newConcatItemInstr);
        this->LowerSetConcatStrMultiItem(newConcatItemInstr);

        linkOpnd = concatItemInstr->GetSrc2();
        index--;
    }
    Assert(index == -1);
    this->LowerNewConcatStrMulti(instr);
}